

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void diy::
     Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
     ::save(BinaryBuffer *bb,Map *m)

{
  _Rb_tree_node_base *p_Var1;
  size_t s;
  size_t local_20;
  
  local_20 = (m->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_20,8);
  for (p_Var1 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Serialization<diy::DynamicPoint<int,_4UL>_>::save(bb,(Point *)(p_Var1 + 1));
    (*bb->_vptr_BinaryBuffer[2])(bb,p_Var1 + 3,4);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Map& m)
    {
      size_t s = m.size();
      diy::save(bb, s);
      for (typename std::map<K,V>::const_iterator it = m.begin(); it != m.end(); ++it)
        diy::save(bb, *it);
    }